

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_cube(rf_vec3 position,float width,float height,float length,rf_color color)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  float x;
  float x_00;
  float y;
  float y_00;
  float z;
  float z_00;
  float local_38;
  float fStack_34;
  
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= prVar3[lVar2].v_counter + 0x24) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_38 = position.x;
  fStack_34 = position.y;
  rf_gfx_translatef(local_38,fStack_34,position.z);
  rf_gfx_begin(RF_TRIANGLES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  x_00 = 0.0 - width * 0.5;
  y = 0.0 - height * 0.5;
  z = length * 0.5 + 0.0;
  rf_gfx_vertex3f(x_00,y,z);
  x = width * 0.5 + 0.0;
  rf_gfx_vertex3f(x,y,z);
  y_00 = height * 0.5 + 0.0;
  rf_gfx_vertex3f(x_00,y_00,z);
  rf_gfx_vertex3f(x,y_00,z);
  rf_gfx_vertex3f(x_00,y_00,z);
  rf_gfx_vertex3f(x,y,z);
  z_00 = 0.0 - length * 0.5;
  rf_gfx_vertex3f(x_00,y,z_00);
  rf_gfx_vertex3f(x_00,y_00,z_00);
  rf_gfx_vertex3f(x,y,z_00);
  rf_gfx_vertex3f(x,y_00,z_00);
  rf_gfx_vertex3f(x,y,z_00);
  rf_gfx_vertex3f(x_00,y_00,z_00);
  rf_gfx_vertex3f(x_00,y_00,z_00);
  rf_gfx_vertex3f(x_00,y_00,z);
  rf_gfx_vertex3f(x,y_00,z);
  rf_gfx_vertex3f(x,y_00,z_00);
  rf_gfx_vertex3f(x_00,y_00,z_00);
  rf_gfx_vertex3f(x,y_00,z);
  rf_gfx_vertex3f(x_00,y,z_00);
  rf_gfx_vertex3f(x,y,z);
  rf_gfx_vertex3f(x_00,y,z);
  rf_gfx_vertex3f(x,y,z_00);
  rf_gfx_vertex3f(x,y,z);
  rf_gfx_vertex3f(x_00,y,z_00);
  rf_gfx_vertex3f(x,y,z_00);
  rf_gfx_vertex3f(x,y_00,z_00);
  rf_gfx_vertex3f(x,y_00,z);
  rf_gfx_vertex3f(x,y,z);
  rf_gfx_vertex3f(x,y,z_00);
  rf_gfx_vertex3f(x,y_00,z);
  rf_gfx_vertex3f(x_00,y,z_00);
  rf_gfx_vertex3f(x_00,y_00,z);
  rf_gfx_vertex3f(x_00,y_00,z_00);
  rf_gfx_vertex3f(x_00,y,z);
  rf_gfx_vertex3f(x_00,y_00,z);
  rf_gfx_vertex3f(x_00,y,z_00);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_cube(rf_vec3 position, float width, float height, float length, rf_color color)
{
    float x = 0.0f;
    float y = 0.0f;
    float z = 0.0f;

    if (rf_gfx_check_buffer_limit(36)) rf_gfx_draw();

    rf_gfx_push_matrix();
    // NOTE: Transformation is applied in inverse order (scale -> rotate -> translate)
    rf_gfx_translatef(position.x, position.y, position.z);
    //rf_gfx_rotatef(45, 0, 1, 0);
    //rf_gfx_scalef(1.0f, 1.0f, 1.0f);   // NOTE: Vertices are directly scaled on definition

    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    // Front face
    rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left

    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right

    // Back face
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Left
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right

    rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right
    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left

    // Top face
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Bottom Left
    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Bottom Right

    rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left
    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Bottom Right

    // Bottom face
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Top Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Left

    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Top Right
    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Top Left

    // Right face
    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right
    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Left

    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Left

    // Left face
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Right

    rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Left
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_end();
    rf_gfx_pop_matrix();
}